

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O3

void __thiscall BmsNoteManager::AllScratch(BmsNoteManager *this,int seed,int sc,int s,int e)

{
  _Rb_tree_color bar;
  bool bVar1;
  _Rb_tree_color _Var2;
  int iVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
  *this_00;
  long lVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_BmsNote>_>,_std::_Rb_tree_iterator<std::pair<const_int,_BmsNote>_>_>
  pVar7;
  vector<int,_std::allocator<int>_> channels;
  set<int,_std::less<int>,_std::allocator<int>_> notemap;
  _Rb_tree_color local_ac;
  int *local_a8;
  iterator iStack_a0;
  int *local_98;
  _Rb_tree_color local_8c;
  BmsNote local_88;
  map<int,_BmsNote,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_> *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_8c = s;
  srand(seed);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar6 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    BmsNoteLane::GetNoteExistBar
              ((BmsNoteLane *)(&this->lanes_[0].notes_ + lVar6),
               (set<int,_std::less<int>,_std::allocator<int>_> *)&local_60);
    lVar6 = lVar6 + 0x30;
  } while (lVar6 != 0x3c0);
  local_a8 = (int *)0x0;
  iStack_a0._M_current = (int *)0x0;
  local_98 = (int *)0x0;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    local_68 = &this->lanes_[sc].notes_;
    p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      bar = p_Var5[1]._M_color;
      BmsNoteLane::Get(&local_88,this->lanes_,bar);
      iVar3 = local_88.type;
      BmsWord::~BmsWord(&local_88.value);
      if (iVar3 == _S_red) {
        local_ac = local_8c;
        _Var2 = local_8c;
        if ((int)local_8c <= e) {
          do {
            local_ac = _Var2;
            if (_Var2 != sc) {
              BmsNoteLane::Get(&local_88,this->lanes_ + (int)_Var2,bar);
              iVar3 = local_88.type;
              BmsWord::~BmsWord(&local_88.value);
              if (iVar3 == _S_black) {
                if (iStack_a0._M_current == local_98) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_a8,iStack_a0,(int *)&local_ac
                            );
                }
                else {
                  *iStack_a0._M_current = local_ac;
                  iStack_a0._M_current = iStack_a0._M_current + 1;
                }
              }
            }
            _Var2 = local_ac + _S_black;
            bVar1 = (int)local_ac < e;
            local_ac = _Var2;
          } while (bVar1);
        }
        iVar3 = rand();
        this_00 = (_Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
                   *)(this->lanes_ +
                     local_a8[(ulong)(long)iVar3 %
                              (ulong)((long)iStack_a0._M_current - (long)local_a8 >> 2)]);
        BmsNoteLane::Get(&local_88,(BmsNoteLane *)this_00,bar);
        local_ac = bar;
        if (local_88.type != _S_red) {
          pmVar4 = std::
                   map<int,_BmsNote,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
                   ::operator[](local_68,(key_type *)&local_ac);
          *(ulong *)&pmVar4->field_0xc = CONCAT44(local_88.pos._0_4_,local_88._12_4_);
          *(undefined8 *)((long)&pmVar4->pos + 4) = local_88._20_8_;
          pmVar4->type = local_88.type;
          pmVar4->value = (BmsWord)local_88.value.value_;
          *(ulong *)&pmVar4->time = CONCAT44(local_88._12_4_,local_88.time);
        }
        BmsWord::~BmsWord(&local_88.value);
        local_88.type = bar;
        pVar7 = std::
                _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
                ::equal_range(this_00,&local_88.type);
        std::
        _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
        ::_M_erase_aux(this_00,(_Base_ptr)pVar7.first._M_node,(_Base_ptr)pVar7.second._M_node);
        if (iStack_a0._M_current != local_a8) {
          iStack_a0._M_current = local_a8;
        }
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != &local_60._M_impl.super__Rb_tree_header);
    if (local_a8 != (int *)0x0) {
      operator_delete(local_a8);
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void BmsNoteManager::AllScratch(int seed, int sc, int s, int e) {
	// get a note randomly from column
	srand(seed);
	std::set<barindex> notemap;
	GetNoteExistBar(notemap);
	std::vector<int> channels;
	for (auto it = notemap.begin(); it != notemap.end(); ++it) {
		barindex bar = *it;
		// SP
		if (lanes_[0].Get(bar).type == BmsNote::NOTE_NONE) {
			// find available note list
			for (int c = s; c <= e; c++) if (c != sc) {
				switch (lanes_[c].Get(bar).type) {
				case BmsNote::NOTE_NORMAL:
					channels.push_back(c);
				}
			}
			// push scratch from available note list
			int nc = channels[rand() % channels.size()];
			lanes_[sc].Set(bar, lanes_[nc].Get(bar));
			lanes_[nc].Delete(bar);
			channels.clear();
		}
	}
}